

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curramt.cpp
# Opt level: O1

void __thiscall
icu_63::CurrencyAmount::CurrencyAmount
          (CurrencyAmount *this,double amount,ConstChar16Ptr *isoCode,UErrorCode *ec)

{
  MeasureUnit *this_00;
  MeasureUnit *adoptedUnit;
  ConstChar16Ptr *size;
  ConstChar16Ptr local_b8;
  char16_t *local_b0;
  Formattable local_a0;
  
  size = isoCode;
  Formattable::Formattable(&local_a0,amount);
  this_00 = (MeasureUnit *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
  if (this_00 == (MeasureUnit *)0x0) {
    adoptedUnit = (MeasureUnit *)0x0;
  }
  else {
    local_b8 = (ConstChar16Ptr)isoCode->p_;
    CurrencyUnit::CurrencyUnit((CurrencyUnit *)this_00,&local_b8,ec);
    adoptedUnit = this_00;
  }
  Measure::Measure(&this->super_Measure,&local_a0,adoptedUnit,ec);
  if (this_00 != (MeasureUnit *)0x0) {
    local_b0 = local_b8.p_;
  }
  Formattable::~Formattable(&local_a0);
  (this->super_Measure).super_UObject._vptr_UObject = (_func_int **)&PTR__CurrencyAmount_0047ccf0;
  return;
}

Assistant:

CurrencyAmount::CurrencyAmount(double amount, ConstChar16Ptr isoCode,
                               UErrorCode& ec) :
    Measure(Formattable(amount), new CurrencyUnit(isoCode, ec), ec) {
}